

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O0

void __thiscall booster::locale::ios_info::string_set::set<char>(string_set *this,char *s)

{
  void *pvVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  char *end;
  char *local_18;
  
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  in_RDI[2] = 0;
  *in_RDI = &char::typeinfo;
  for (local_18 = in_RSI; *local_18 != '\0'; local_18 = local_18 + 1) {
  }
  in_RDI[1] = local_18 + (1 - (long)in_RSI);
  pvVar1 = operator_new__(in_RDI[1]);
  in_RDI[2] = pvVar1;
  memcpy((void *)in_RDI[2],in_RSI,in_RDI[1]);
  return;
}

Assistant:

void set(Char const *s)
                {
                    delete [] ptr;
                    ptr = 0;
                    type=&typeid(Char);
                    Char const *end = s;
                    while(*end!=0) end++;
                    // if ptr = 0 it does not matter what is value of size
                    size = sizeof(Char)*(end - s+1);
                    ptr = new char[size];
                    memcpy(ptr,s,size);
                }